

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandTopmost(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLevels;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  nLevels = 10;
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    iVar4 = globalUtilOptind;
    if (iVar1 != 0x4e) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType != ABC_NTK_STRASH) {
            pcVar3 = "Currently only works for structurally hashed circuits.\n";
LAB_002042cf:
            Abc_Print(-1,pcVar3);
            return 0;
          }
          if (0 < pAVar2->nObjCounts[8]) {
            pcVar3 = "Currently can only works for combinational circuits.\n";
            goto LAB_002042cf;
          }
          if (pAVar2->vPos->nSize != 1) {
            pcVar3 = "Currently expects a single-output miter.\n";
            goto LAB_002042cf;
          }
          pAVar2 = Abc_NtkTopmost(pAVar2,nLevels);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "The command has failed.\n";
        }
        iVar4 = -1;
        goto LAB_0020429d;
      }
      goto LAB_00204243;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_00204243;
    }
    nLevels = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nLevels < 0) {
LAB_00204243:
      Abc_Print(-2,"usage: topmost [-N num] [-h]\n");
      Abc_Print(-2,"\t         replaces the current network by several of its topmost levels\n");
      Abc_Print(-2,"\t-N num : max number of levels [default = %d]\n",(ulong)nLevels);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar3 = "\tname   : the node name\n";
      iVar4 = -2;
LAB_0020429d:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTopmost( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nLevels;
    extern Abc_Ntk_t * Abc_NtkTopmost( Abc_Ntk_t * pNtk, int nLevels );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nLevels = 10;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only works for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently expects a single-output miter.\n" );
        return 0;
    }

    pNtkRes = Abc_NtkTopmost( pNtk, nLevels );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: topmost [-N num] [-h]\n" );
    Abc_Print( -2, "\t         replaces the current network by several of its topmost levels\n" );
    Abc_Print( -2, "\t-N num : max number of levels [default = %d]\n", nLevels );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tname   : the node name\n");
    return 1;
}